

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

void D_Display(void)

{
  SoundRenderer *pSVar1;
  FFont *pFVar2;
  DFrameBuffer *pDVar3;
  bool bVar4;
  uint uVar5;
  EHudState state_00;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  AActor *pAVar10;
  char *pcVar11;
  FTexture *pFVar12;
  float local_94;
  bool done;
  uint diff;
  uint nowtime_1;
  uint wipestart;
  FTexture *texture;
  FTexture *tex_1;
  FTextureID picnum;
  FString local_58;
  FString pstring;
  int x;
  FTexture *tex;
  EHudState state;
  int saved_ST_Y;
  float blend [4];
  uint nowtime;
  cycle_t local_18;
  cycle_t cycles;
  bool hw2d;
  bool wipe;
  
  if ((!nodrawers) && (screen != (DFrameBuffer *)0x0)) {
    cycle_t::Reset(&local_18);
    cycle_t::Clock(&local_18);
    bVar4 = TObjPtr<AActor>::operator==
                      ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0),
                       (AActor *)0x0);
    if (bVar4) {
      TObjPtr<AActor>::operator=
                ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0),
                 (AActor *)(&players)[(long)consoleplayer * 0x54]);
    }
    if ((viewactive & 1U) != 0) {
      pAVar10 = TObjPtr::operator_cast_to_AActor_
                          ((TObjPtr *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
      if ((pAVar10 == (AActor *)0x0) ||
         (pAVar10 = TObjPtr<AActor>::operator->
                              ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0)),
         pAVar10->player == (player_t *)0x0)) {
        local_94 = 90.0;
      }
      else {
        pAVar10 = TObjPtr<AActor>::operator->
                            ((TObjPtr<AActor> *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
        local_94 = pAVar10->player->FOV;
      }
      TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffe0,(double)local_94);
      R_SetFOV((DAngle *)&stack0xffffffffffffffe0);
    }
    if (((setmodeneeded & 1U) != 0) &&
       (uVar5 = (*Video->_vptr_IVideo[7])
                          (Video,(ulong)(uint)NewWidth,(ulong)(uint)NewHeight,(ulong)(uint)NewBits),
       (uVar5 & 1) != 0)) {
      setsizeneeded = true;
      if (StatusBar != (DBaseStatusBar *)0x0) {
        (*(StatusBar->super_DObject)._vptr_DObject[0xe])();
      }
      C_NewModeAdjust();
      ST_LoadCrosshair(true);
      AM_NewResolution();
      FBaseCVar::Callback(&vid_cursor.super_FBaseCVar);
    }
    RenderTarget = (DCanvas *)screen;
    if (((setsizeneeded & 1U) != 0) && (StatusBar != (DBaseStatusBar *)0x0)) {
      R_ExecuteSetViewSize();
    }
    setmodeneeded = false;
    uVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[8])(screen,0);
    if ((uVar5 & 1) != 0) {
      ST_SetNeedRefresh();
      V_SetBorderNeedRefresh();
    }
    if (NoWipe == 0) {
      if (((gamestate == wipegamestate) || (gamestate == GS_FULLCONSOLE)) ||
         (gamestate == GS_TITLELEVEL)) {
        cycles.Sec._7_1_ = 0;
      }
      else {
        V_SetBorderNeedRefresh();
        pDVar3 = screen;
        if (wipegamestate == GS_FORCEWIPEMELT) {
          iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2a])
                            (screen,1);
          cycles.Sec._7_1_ = (byte)iVar6 & 1;
        }
        else if (wipegamestate == GS_FORCEWIPEBURN) {
          iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2a])
                            (screen,2);
          cycles.Sec._7_1_ = (byte)iVar6 & 1;
        }
        else if (wipegamestate == GS_FORCEWIPEFADE) {
          iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2a])
                            (screen,3);
          cycles.Sec._7_1_ = (byte)iVar6 & 1;
        }
        else {
          uVar5 = FIntCVar::operator_cast_to_int(&wipetype);
          iVar6 = (*(pDVar3->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2a])
                            (pDVar3,(ulong)uVar5);
          cycles.Sec._7_1_ = (byte)iVar6 & 1;
        }
        wipegamestate = gamestate;
      }
    }
    else {
      V_SetBorderNeedRefresh();
      NoWipe = NoWipe + -1;
      cycles.Sec._7_1_ = 0;
      wipegamestate = gamestate;
    }
    cycles.Sec._6_1_ = 0;
    blend[3] = (float)I_FPSTime();
    FTextureManager::UpdateAnimations(&TexMan,(DWORD)blend[3]);
    R_UpdateSky((DWORD)blend[3]);
    switch(gamestate) {
    case GS_LEVEL:
    case GS_TITLELEVEL:
      if (gametic != 0) {
        if (StatusBar != (DBaseStatusBar *)0x0) {
          memset(&state,0,0x10);
          (*(StatusBar->super_DObject)._vptr_DObject[0xc])(StatusBar,&state);
        }
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])
                  (screen,(ulong)(uint)viewwindowx,(ulong)(uint)viewwindowy,
                   (ulong)(uint)(viewwindowx + viewwidth),(ulong)(uint)(viewwindowy + viewheight));
        (*Renderer->_vptr_FRenderer[4])(Renderer,&players + (long)consoleplayer * 0x54);
        uVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])();
        cycles.Sec._6_1_ = (byte)uVar5 & 1;
        if ((uVar5 & 1) != 0) {
          ST_SetNeedRefresh();
          V_SetBorderNeedRefresh();
        }
        (*Renderer->_vptr_FRenderer[7])();
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x26])();
        iVar6 = ST_Y;
        if ((automapactive & 1U) != 0) {
          bVar4 = FBoolCVar::operator_cast_to_bool(&hud_althud);
          iVar7 = viewheight;
          if ((bVar4) && (iVar8 = DCanvas::GetHeight((DCanvas *)screen), iVar7 == iVar8)) {
            ST_Y = viewheight;
          }
          AM_Drawer();
        }
        ST_Y = iVar6;
        if (((automapactive & 1U) == 0) || ((viewactive & 1U) != 0)) {
          V_RefreshViewBorder();
        }
        bVar4 = FBoolCVar::operator_cast_to_bool(&hud_althud);
        iVar6 = viewheight;
        if (((bVar4) && (iVar7 = DCanvas::GetHeight((DCanvas *)screen), iVar6 == iVar7)) &&
           (iVar6 = FIntCVar::operator_cast_to_int(&screenblocks), 10 < iVar6)) {
          DBaseStatusBar::DrawBottomStuff(StatusBar,HUD_AltHud);
          if (((DrawFSHUD & 1U) != 0) || ((automapactive & 1U) != 0)) {
            DrawHUD();
          }
          (*(StatusBar->super_DObject)._vptr_DObject[8])(StatusBar,3);
          DBaseStatusBar::DrawTopStuff(StatusBar,HUD_AltHud);
        }
        else {
          iVar6 = viewheight;
          iVar7 = DCanvas::GetHeight((DCanvas *)screen);
          if (((iVar6 == iVar7) && ((viewactive & 1U) != 0)) &&
             (iVar6 = FIntCVar::operator_cast_to_int(&screenblocks), 10 < iVar6)) {
            state_00 = HUD_None;
            if ((DrawFSHUD & 1U) != 0) {
              state_00 = HUD_Fullscreen;
            }
            DBaseStatusBar::DrawBottomStuff(StatusBar,state_00);
            (*(StatusBar->super_DObject)._vptr_DObject[8])(StatusBar,(ulong)state_00);
            DBaseStatusBar::DrawTopStuff(StatusBar,state_00);
          }
          else {
            DBaseStatusBar::DrawBottomStuff(StatusBar,HUD_StatusBar);
            (*(StatusBar->super_DObject)._vptr_DObject[8])();
            DBaseStatusBar::DrawTopStuff(StatusBar,HUD_StatusBar);
          }
        }
        CT_Drawer();
      }
      break;
    case GS_INTERMISSION:
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0)
      ;
      iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                        (screen,0);
      cycles.Sec._6_1_ = (byte)iVar6 & 1;
      WI_Drawer();
      CT_Drawer();
      break;
    case GS_FINALE:
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0)
      ;
      iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                        (screen,0);
      cycles.Sec._6_1_ = (byte)iVar6 & 1;
      F_Drawer();
      CT_Drawer();
      break;
    case GS_DEMOSCREEN:
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0)
      ;
      iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                        (screen,0);
      cycles.Sec._6_1_ = (byte)iVar6 & 1;
      D_PageDrawer();
      CT_Drawer();
      break;
    case GS_FULLCONSOLE:
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0)
      ;
      iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                        (screen,0);
      cycles.Sec._6_1_ = (byte)iVar6 & 1;
      C_DrawConsole(false);
      M_Drawer();
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
      return;
    default:
    }
    if (((paused != 0) || ((pauseext & 1U) != 0)) && (menuactive == MENU_Off)) {
      FString::FString(&local_58,"By ");
      pcVar11 = FString::operator_cast_to_char_(&gameinfo.PauseSign);
      pFVar12 = FTextureManager::operator()(&TexMan,pcVar11);
      iVar6 = DCanvas::GetWidth((DCanvas *)screen);
      iVar7 = FTexture::GetScaledWidth(pFVar12);
      iVar7 = iVar7 * CleanXfac;
      iVar8 = FTexture::GetScaledLeftOffset(pFVar12);
      pstring.Chars._4_4_ = (iVar6 - iVar7) / 2 + iVar8 * CleanXfac;
      DCanvas::DrawTexture((DCanvas *)screen,pFVar12,(double)pstring.Chars._4_4_,4.0,0x40001393,1,0)
      ;
      if ((paused != 0) && ((multiplayer & 1U) != 0)) {
        pcVar11 = userinfo_t::GetName((userinfo_t *)((long)(paused + -1) * 0x2a0 + 0xd63498));
        FString::operator+=(&local_58,pcVar11);
        pDVar3 = screen;
        pFVar2 = SmallFont;
        iVar6 = DCanvas::GetWidth((DCanvas *)screen);
        iVar7 = FFont::StringWidth(SmallFont,&local_58);
        iVar7 = iVar7 * CleanXfac;
        iVar8 = FTexture::GetScaledHeight(pFVar12);
        iVar8 = iVar8 * CleanYfac;
        pcVar11 = FString::operator_cast_to_char_(&local_58);
        DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,6,(iVar6 - iVar7) / 2,iVar8 + 4,pcVar11,
                          0x40001393,1,0);
      }
      FString::~FString(&local_58);
    }
    if (D_DrawIcon != (char *)0x0) {
      tex_1._0_4_ = FTextureManager::CheckForTexture(&TexMan,D_DrawIcon,8,1);
      D_DrawIcon = (char *)0x0;
      bVar4 = FTextureID::isValid((FTextureID *)&tex_1);
      if (bVar4) {
        pFVar12 = FTextureManager::operator[](&TexMan,tex_1._0_4_);
        pDVar3 = screen;
        iVar6 = FTexture::GetScaledWidth(pFVar12);
        iVar7 = FTexture::GetScaledHeight(pFVar12);
        DCanvas::DrawTexture
                  ((DCanvas *)pDVar3,pFVar12,(double)(0xa0 - iVar6 / 2),(double)(100 - iVar7 / 2),
                   0x40001391,1,0);
      }
      NoWipe = 10;
    }
    iVar6 = FIntCVar::operator_cast_to_int(&texture_browse_index);
    if (iVar6 != -1) {
      iVar6 = FIntCVar::operator_cast_to_int(&texture_browse_index);
      iVar7 = FTextureManager::NumTextures(&TexMan);
      if (iVar6 < iVar7) {
        iVar6 = FIntCVar::operator_cast_to_int(&texture_browse_index);
        pFVar12 = FTextureManager::ByIndex(&TexMan,iVar6);
        DCanvas::DrawTexture
                  ((DCanvas *)screen,pFVar12,0.0,0.0,0x40001391,1,0x4000139b,0,0x4000139c,0,0);
        pDVar3 = screen;
        pFVar2 = ConFont;
        iVar6 = DCanvas::GetHeight((DCanvas *)screen);
        iVar7 = FFont::GetHeight(ConFont);
        pcVar11 = FString::operator_cast_to_char_(&pFVar12->Name);
        DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,9,0,iVar6 - iVar7,pcVar11,0);
      }
    }
    iVar6 = FIntCVar::operator_cast_to_int(&snd_drawoutput);
    pSVar1 = GSnd;
    if (iVar6 != 0) {
      uVar5 = FIntCVar::operator_cast_to_int(&snd_drawoutput);
      (*pSVar1->_vptr_SoundRenderer[0x20])(pSVar1,(ulong)uVar5);
    }
    if (((cycles.Sec._7_1_ & 1) == 0) || (NoWipe < 0)) {
      NetUpdate();
      C_DrawConsole((bool)(cycles.Sec._6_1_ & 1));
      M_Drawer();
      FStat::PrintStat();
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
    }
    else {
      (*GSnd->_vptr_SoundRenderer[0x16])(GSnd,1);
      (*I_FreezeTime)(true);
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2b])();
      diff = I_MSTime();
      NetUpdate();
      do {
        do {
          iVar6 = FIntCVar::operator_cast_to_int(&cl_wipe_delay);
          I_WaitVBL(iVar6);
          uVar5 = I_MSTime();
          uVar9 = (uVar5 - diff) * 0x28;
        } while (uVar9 / 1000 == 0);
        iVar6 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2c])
                          (screen,1,(ulong)uVar9 % 1000);
        C_DrawConsole((bool)(cycles.Sec._6_1_ & 1));
        M_Drawer();
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
        NetUpdate();
        diff = uVar5;
      } while ((((byte)iVar6 & 1 ^ 0xff) & 1) != 0);
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2d])();
      (*I_FreezeTime)(false);
      (*GSnd->_vptr_SoundRenderer[0x16])(GSnd,0,1);
    }
    cycle_t::Unclock(&local_18);
    cycle_t::operator=(&FrameCycles,&local_18);
  }
  return;
}

Assistant:

void D_Display ()
{
	bool wipe;
	bool hw2d;

	if (nodrawers || screen == NULL)
		return; 				// for comparative timing / profiling
	
	cycle_t cycles;
	
	cycles.Reset();
	cycles.Clock();

	if (players[consoleplayer].camera == NULL)
	{
		players[consoleplayer].camera = players[consoleplayer].mo;
	}

	if (viewactive)
	{
		R_SetFOV (players[consoleplayer].camera && players[consoleplayer].camera->player ?
			players[consoleplayer].camera->player->FOV : 90.f);
	}

	// [RH] change the screen mode if needed
	if (setmodeneeded)
	{
		// Change screen mode.
		if (Video->SetResolution (NewWidth, NewHeight, NewBits))
		{
			// Recalculate various view parameters.
			setsizeneeded = true;
			// Let the status bar know the screen size changed
			if (StatusBar != NULL)
			{
				StatusBar->ScreenSizeChanged ();
			}
			// Refresh the console.
			C_NewModeAdjust ();
			// Reload crosshair if transitioned to a different size
			ST_LoadCrosshair (true);
			AM_NewResolution ();
			// Reset the mouse cursor in case the bit depth changed
			vid_cursor.Callback();
		}
	}

	RenderTarget = screen;

	// change the view size if needed
	if (setsizeneeded && StatusBar != NULL)
	{
		R_ExecuteSetViewSize ();
	}
	setmodeneeded = false;

	if (screen->Lock (false))
	{
		ST_SetNeedRefresh();
		V_SetBorderNeedRefresh();
	}

	// [RH] Allow temporarily disabling wipes
	if (NoWipe)
	{
		V_SetBorderNeedRefresh();
		NoWipe--;
		wipe = false;
		wipegamestate = gamestate;
	}
	else if (gamestate != wipegamestate && gamestate != GS_FULLCONSOLE && gamestate != GS_TITLELEVEL)
	{ // save the current screen if about to wipe
		V_SetBorderNeedRefresh();
		switch (wipegamestate)
		{
		default:
			wipe = screen->WipeStartScreen (wipetype);
			break;

		case GS_FORCEWIPEFADE:
			wipe = screen->WipeStartScreen (wipe_Fade);
			break;

		case GS_FORCEWIPEBURN:
			wipe = screen->WipeStartScreen (wipe_Burn);
			break;

		case GS_FORCEWIPEMELT:
			wipe = screen->WipeStartScreen (wipe_Melt);
			break;
		}
		wipegamestate = gamestate;
	}
	else
	{
		wipe = false;
	}

	hw2d = false;


	{
		unsigned int nowtime = I_FPSTime();
		TexMan.UpdateAnimations(nowtime);
		R_UpdateSky(nowtime);
		switch (gamestate)
		{
		case GS_FULLCONSOLE:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			C_DrawConsole (false);
			M_Drawer ();
			screen->Update ();
			return;

		case GS_LEVEL:
		case GS_TITLELEVEL:
			if (!gametic)
				break;

			if (StatusBar != NULL)
			{
				float blend[4] = { 0, 0, 0, 0 };
				StatusBar->BlendView (blend);
			}
			screen->SetBlendingRect(viewwindowx, viewwindowy,
				viewwindowx + viewwidth, viewwindowy + viewheight);

			Renderer->RenderView(&players[consoleplayer]);

			if ((hw2d = screen->Begin2D(viewactive)))
			{
				// Redraw everything every frame when using 2D accel
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
			Renderer->DrawRemainingPlayerSprites();
			screen->DrawBlendingRect();
			if (automapactive)
			{
				int saved_ST_Y = ST_Y;
				if (hud_althud && viewheight == SCREENHEIGHT)
				{
					ST_Y = viewheight;
				}
				AM_Drawer ();
				ST_Y = saved_ST_Y;
			}
			if (!automapactive || viewactive)
			{
				V_RefreshViewBorder ();
			}

			if (hud_althud && viewheight == SCREENHEIGHT && screenblocks > 10)
			{
				StatusBar->DrawBottomStuff (HUD_AltHud);
				if (DrawFSHUD || automapactive) DrawHUD();
				StatusBar->Draw (HUD_AltHud);
				StatusBar->DrawTopStuff (HUD_AltHud);
			}
			else 
			if (viewheight == SCREENHEIGHT && viewactive && screenblocks > 10)
			{
				EHudState state = DrawFSHUD ? HUD_Fullscreen : HUD_None;
				StatusBar->DrawBottomStuff (state);
				StatusBar->Draw (state);
				StatusBar->DrawTopStuff (state);
			}
			else
			{
				StatusBar->DrawBottomStuff (HUD_StatusBar);
				StatusBar->Draw (HUD_StatusBar);
				StatusBar->DrawTopStuff (HUD_StatusBar);
			}
			CT_Drawer ();
			break;

		case GS_INTERMISSION:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			WI_Drawer ();
			CT_Drawer ();
			break;

		case GS_FINALE:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			F_Drawer ();
			CT_Drawer ();
			break;

		case GS_DEMOSCREEN:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			D_PageDrawer ();
			CT_Drawer ();
			break;

		default:
			break;
		}
	}
	// draw pause pic
	if ((paused || pauseext) && menuactive == MENU_Off)
	{
		FTexture *tex;
		int x;
		FString pstring = "By ";

		tex = TexMan(gameinfo.PauseSign);
		x = (SCREENWIDTH - tex->GetScaledWidth() * CleanXfac)/2 +
			tex->GetScaledLeftOffset() * CleanXfac;
		screen->DrawTexture (tex, x, 4, DTA_CleanNoMove, true, TAG_DONE);
		if (paused && multiplayer)
		{
			pstring += players[paused - 1].userinfo.GetName();
			screen->DrawText(SmallFont, CR_RED,
				(screen->GetWidth() - SmallFont->StringWidth(pstring)*CleanXfac) / 2,
				(tex->GetScaledHeight() * CleanYfac) + 4, pstring, DTA_CleanNoMove, true, TAG_DONE);
		}
	}

	// [RH] Draw icon, if any
	if (D_DrawIcon)
	{
		FTextureID picnum = TexMan.CheckForTexture (D_DrawIcon, FTexture::TEX_MiscPatch);

		D_DrawIcon = NULL;
		if (picnum.isValid())
		{
			FTexture *tex = TexMan[picnum];
			screen->DrawTexture (tex, 160 - tex->GetScaledWidth()/2, 100 - tex->GetScaledHeight()/2,
				DTA_320x200, true, TAG_DONE);
		}
		NoWipe = 10;
	}

	if (-1 != texture_browse_index && texture_browse_index < TexMan.NumTextures())
	{
		FTexture* const texture = TexMan.ByIndex(texture_browse_index);

		screen->DrawTexture(texture, 0, 0, 
			DTA_320x200, true, DTA_TopOffset, 0, DTA_LeftOffset, 0, TAG_DONE);
		screen->DrawText(ConFont, CR_WHITE, 0, SCREENHEIGHT - ConFont->GetHeight(), texture->Name, TAG_DONE);
	}

	if (snd_drawoutput)
	{
		GSnd->DrawWaveDebug(snd_drawoutput);
	}

	if (!wipe || NoWipe < 0)
	{
		NetUpdate ();			// send out any new accumulation
		// normal update
		C_DrawConsole (hw2d);	// draw console
		M_Drawer ();			// menu is drawn even on top of everything
		FStat::PrintStat ();
		screen->Update ();		// page flip or blit buffer
	}
	else
	{
		// wipe update
		unsigned int wipestart, nowtime, diff;
		bool done;

		GSnd->SetSfxPaused(true, 1);
		I_FreezeTime(true);
		screen->WipeEndScreen ();

		wipestart = I_MSTime();
		NetUpdate();		// send out any new accumulation

		do
		{
			do
			{
				I_WaitVBL( cl_wipe_delay );
				nowtime = I_MSTime();
				diff = (nowtime - wipestart) * 40 / 1000;	// Using 35 here feels too slow.
			} while (diff < 1);
			wipestart = nowtime;
			done = screen->WipeDo (1);
			C_DrawConsole (hw2d);	// console and
			M_Drawer ();			// menu are drawn even on top of wipes
			screen->Update ();		// page flip or blit buffer
			NetUpdate ();			// [RH] not sure this is needed anymore
		} while (!done);
		screen->WipeCleanup();
		I_FreezeTime(false);
		GSnd->SetSfxPaused(false, 1);
	}

	cycles.Unclock();
	FrameCycles = cycles;
}